

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.h
# Opt level: O2

void __thiscall bloaty::RollupRow::~RollupRow(RollupRow *this)

{
  std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>::~vector
            (&this->sorted_children);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

RollupRow(const std::string& name_) : name(name_) {}